

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

Cbs_Man_t * Cbs_ManAlloc(void)

{
  Cbs_Man_t *pPars;
  Gia_Obj_t **ppGVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Cbs_Man_t *p;
  
  pPars = (Cbs_Man_t *)calloc(1,0xe0);
  (pPars->pClauses).nSize = 10000;
  (pPars->pJust).nSize = 10000;
  (pPars->pProp).nSize = 10000;
  ppGVar1 = (Gia_Obj_t **)malloc((long)(pPars->pProp).nSize << 3);
  (pPars->pProp).pData = ppGVar1;
  ppGVar1 = (Gia_Obj_t **)malloc((long)(pPars->pJust).nSize << 3);
  (pPars->pJust).pData = ppGVar1;
  ppGVar1 = (Gia_Obj_t **)malloc((long)(pPars->pClauses).nSize << 3);
  (pPars->pClauses).pData = ppGVar1;
  (pPars->pClauses).iTail = 1;
  (pPars->pClauses).iHead = 1;
  pVVar2 = Vec_IntAlloc(1000);
  pPars->vModel = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pPars->vLevReas = pVVar2;
  pVVar3 = Vec_PtrAlloc(1000);
  pPars->vTemp = pVVar3;
  Cbs_SetDefaultParams((Cbs_Par_t *)pPars);
  return pPars;
}

Assistant:

Cbs_Man_t * Cbs_ManAlloc()
{
    Cbs_Man_t * p;
    p = ABC_CALLOC( Cbs_Man_t, 1 );
    p->pProp.nSize = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData = ABC_ALLOC( Gia_Obj_t *, p->pProp.nSize );
    p->pJust.pData = ABC_ALLOC( Gia_Obj_t *, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( Gia_Obj_t *, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel   = Vec_IntAlloc( 1000 );
    p->vLevReas = Vec_IntAlloc( 1000 );
    p->vTemp    = Vec_PtrAlloc( 1000 );
    Cbs_SetDefaultParams( &p->Pars );
    return p;
}